

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_modinv32_modinfo *in_RSI;
  void *in_RDI;
  secp256k1_modinv32_trans2x2 t;
  int32_t gn;
  int32_t fn;
  int32_t cond;
  int32_t eta;
  int len;
  int j;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 e;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_trans2x2 sStackY_c8;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  int32_t local_ac;
  int local_a8;
  int local_a4;
  uint local_a0 [4];
  secp256k1_modinv32_trans2x2 *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  int32_t in_stack_ffffffffffffff84;
  secp256k1_modinv32_signed30 local_58;
  secp256k1_modinv32_signed30 local_34;
  secp256k1_modinv32_modinfo *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_34,0,0x24);
  memset(&local_58,0,0x24);
  local_58.v[0] = 1;
  memcpy(&stack0xffffffffffffff84,local_10,0x24);
  memcpy(local_a0,local_8,0x24);
  local_a8 = 9;
  local_ac = -1;
  do {
    local_ac = secp256k1_modinv32_divsteps_30_var
                         (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
    secp256k1_modinv32_update_de_30(&local_34,&local_58,&sStackY_c8,local_10);
    secp256k1_modinv32_update_fg_30_var
              (local_a8,(secp256k1_modinv32_signed30 *)&stack0xffffffffffffff84,
               (secp256k1_modinv32_signed30 *)local_a0,&sStackY_c8);
    if (local_a0[0] == 0) {
      local_b0 = 0;
      for (local_a4 = 1; local_a4 < local_a8; local_a4 = local_a4 + 1) {
        local_b0 = local_a0[local_a4] | local_b0;
      }
      if (local_b0 == 0) {
        secp256k1_modinv32_normalize_30
                  (&local_34,*(int32_t *)(&stack0xffffffffffffff84 + (long)(local_a8 + -1) * 4),
                   local_10);
        memcpy(local_8,&local_34,0x24);
        return;
      }
    }
    local_b4 = *(uint *)(&stack0xffffffffffffff84 + (long)(local_a8 + -1) * 4);
    local_b8 = local_a0[local_a8 + -1];
    local_b0 = local_b8 ^ (int)local_b8 >> 0x1f |
               local_b4 ^ (int)local_b4 >> 0x1f | local_a8 + -2 >> 0x1f;
    if (local_b0 == 0) {
      *(uint *)(&stack0xffffffffffffff84 + (long)(local_a8 + -2) * 4) =
           local_b4 << 0x1e | *(uint *)(&stack0xffffffffffffff84 + (long)(local_a8 + -2) * 4);
      local_a0[local_a8 + -2] = local_b8 << 0x1e | local_a0[local_a8 + -2];
      local_a8 = local_a8 + -1;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}